

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall tetgenio::load_vtk(tetgenio *this,char *filebasename)

{
  undefined1 (*__ptr) [16];
  undefined1 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  FILE *__stream;
  byte *pbVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  facet *pfVar12;
  long lVar13;
  polygon *ppVar14;
  int *piVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  bool bVar18;
  uint uVar19;
  char *pcVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  int *__ptr_00;
  tetgenio *ptVar25;
  long lVar26;
  float *pfVar27;
  int nn;
  int id3;
  int id2;
  int id1;
  int nverts;
  float _z;
  float _y;
  int nfaces;
  float _x;
  int dummy;
  char mode [128];
  char fmt [64];
  char id [256];
  char infilename [1024];
  char line [2048];
  long local_e70;
  byte *local_e68;
  int local_e5c;
  int local_e58;
  int local_e54;
  int local_e50;
  uint local_e4c;
  float local_e48;
  float local_e44;
  tetgenio *local_e40;
  uint local_e38;
  float local_e34;
  long local_e30;
  long local_e28;
  long local_e20;
  long local_e18;
  long local_e10;
  long local_e08;
  undefined1 local_dfc [4];
  undefined4 local_df8;
  short local_df4;
  undefined1 uStack_df2;
  undefined4 local_d78;
  short local_d74;
  undefined1 uStack_d72;
  undefined4 local_d38;
  short sStack_d34;
  undefined1 uStack_d32;
  undefined1 uStack_d31;
  char local_d30;
  char acStack_c3c [4];
  char local_c38 [4];
  undefined1 auStack_c34 [1019];
  undefined1 local_839;
  byte local_838 [2056];
  
  local_e4c = 0;
  local_e38 = 0;
  local_e5c = -1;
  strncpy(local_c38,filebasename,0x3ff);
  local_839 = 0;
  if (local_c38[0] == '\0') {
    pcVar20 = "Error:  No filename.";
    goto LAB_0011300c;
  }
  sVar7 = strlen(local_c38);
  iVar6 = strcmp(acStack_c3c + sVar7,".vtk");
  if (iVar6 != 0) {
    sVar7 = strlen(local_c38);
    builtin_strncpy(local_c38 + sVar7,".vtk",4);
    auStack_c34[sVar7] = 0;
  }
  __stream = fopen(local_c38,"r");
  if (__stream == (FILE *)0x0) {
    printf("Error:  Unable to open file %s\n",local_c38);
    return false;
  }
  printf("Opening %s.\n",local_c38);
  this->firstnumber = 0;
  local_df8 = 0x414e4942;
  local_df4 = 0x5952;
  uStack_df2 = 0;
  pbVar8 = (byte *)fgets((char *)local_838,0x7ff,__stream);
  if (pbVar8 == (byte *)0x0) {
    return true;
  }
  uVar24 = 1;
  uVar19 = 0;
  local_e40 = this;
  do {
    while (uVar10 = (ulong)*pbVar8, uVar10 < 0x21) {
      if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
        if ((0x2401UL >> (uVar10 & 0x3f) & 1) == 0) break;
LAB_00112aaf:
        pbVar8 = (byte *)fgets((char *)local_838,0x7ff,__stream);
        if (pbVar8 == (byte *)0x0) goto LAB_00113338;
        uVar24 = uVar24 + 1;
      }
      else {
        pbVar8 = pbVar8 + 1;
      }
    }
    if (((ulong)local_838[0] < 0x24) && ((0x900002401U >> ((ulong)local_838[0] & 0x3f) & 1) != 0))
    goto LAB_00112aaf;
    __isoc99_sscanf(local_838,"%s",&local_d38);
    if (sStack_d34 == 0x49 && local_d38 == 0x49435341) {
      local_df4 = 0x49;
      local_df8 = 0x49435341;
    }
    if (CONCAT13(uStack_d32,CONCAT21(sStack_d34,local_d38._3_1_)) != 0x53544e ||
        local_d38 != 0x4e494f50) {
      if (local_d30 != '\0' ||
          CONCAT17(uStack_d31,CONCAT16(uStack_d32,CONCAT24(sStack_d34,local_d38))) !=
          0x534e4f47594c4f50) {
        if ((sStack_d34 == 0x53 && local_d38 == 0x454e494c) ||
           (sStack_d34 == 0x53 && local_d38 == 0x4c4c4543)) {
          puts("Warning:  load_vtk(): cannot read formats LINES, CELLS.");
        }
        goto LAB_00112aaf;
      }
      __isoc99_sscanf(local_838,"%s %d  %d",&local_d38,&local_e38,local_dfc);
      uVar24 = local_e38;
      ptVar25 = local_e40;
      if ((long)(int)local_e38 < 1) goto LAB_00113327;
      local_e40->numberoffacets = local_e38;
      pfVar12 = (facet *)operator_new__((long)(int)local_e38 << 5);
      ptVar25->facetlist = pfVar12;
      if (CONCAT13(uStack_df2,CONCAT21(local_df4,local_df8._3_1_)) == 0x595241 &&
          local_df8 == 0x414e4942) {
        iVar6 = -1;
        local_e70 = 0;
        goto LAB_0011337e;
      }
      if ((local_df4 != 0x49 || local_df8 != 0x49435341) || (int)uVar24 < 1) goto LAB_00113327;
      iVar6 = -1;
      local_e70 = 0;
      goto LAB_001130ec;
    }
    local_e68 = pbVar8;
    __isoc99_sscanf(local_838,"%s %d %s",&local_d38,&local_e4c,&local_d78);
    ptVar25 = local_e40;
    uVar5 = local_e4c;
    if (0 < (int)local_e4c) {
      local_e40->numberofpoints = local_e4c;
      pdVar9 = (double *)operator_new__((ulong)local_e4c * 0x18);
      ptVar25->pointlist = pdVar9;
      uVar19 = uVar5 + 1;
      if (CONCAT13(uStack_df2,CONCAT21(local_df4,local_df8._3_1_)) == 0x595241 &&
          local_df8 == 0x414e4942) {
        lVar13 = 8;
        lVar21 = 0xf;
        lVar26 = 0x10;
        lVar22 = 0x17;
        lVar23 = 0;
        lVar11 = 0;
        do {
          pdVar9 = local_e40->pointlist;
          __ptr = (undefined1 (*) [16])(pdVar9 + lVar11 * 3);
          local_e30 = lVar13;
          local_e28 = lVar26;
          local_e20 = lVar21;
          local_e18 = lVar23;
          local_e10 = lVar22;
          local_e08 = lVar11;
          if (CONCAT13(uStack_d72,CONCAT21(local_d74,local_d78._3_1_)) == 0x656c62 &&
              local_d78 == 0x62756f64) {
            fread(__ptr,8,1,__stream);
            fread((void *)((long)*__ptr + 8),8,1,__stream);
            fread(__ptr + 1,8,1,__stream);
            puVar16 = (undefined1 *)((long)pdVar9 + local_e18);
            lVar13 = 7;
            puVar17 = puVar16;
            do {
              uVar1 = *puVar17;
              *puVar17 = puVar16[lVar13];
              puVar16[lVar13] = uVar1;
              lVar13 = lVar13 + -1;
              puVar17 = puVar17 + 1;
            } while (lVar13 != 3);
            puVar16 = (undefined1 *)((long)pdVar9 + local_e20);
            lVar13 = 0;
            do {
              uVar1 = *(undefined1 *)((long)pdVar9 + lVar13 + local_e30);
              *(undefined1 *)((long)pdVar9 + lVar13 + local_e30) = *puVar16;
              *puVar16 = uVar1;
              lVar13 = lVar13 + 1;
              puVar16 = puVar16 + -1;
            } while (lVar13 != 4);
            puVar16 = (undefined1 *)((long)pdVar9 + local_e10);
            lVar11 = 0;
            do {
              uVar1 = *(undefined1 *)((long)pdVar9 + lVar11 + local_e28);
              *(undefined1 *)((long)pdVar9 + lVar11 + local_e28) = *puVar16;
              *puVar16 = uVar1;
              lVar11 = lVar11 + 1;
              puVar16 = puVar16 + -1;
              lVar26 = local_e28;
              lVar13 = local_e30;
              lVar21 = local_e20;
              lVar22 = local_e10;
              lVar23 = local_e18;
            } while (lVar11 != 4);
          }
          else {
            if (local_d74 != 0x74 || local_d78 != 0x616f6c66) {
              pcVar20 = "Error: Only float or double formats are supported!";
              goto LAB_0011300c;
            }
            pfVar27 = &local_e34;
            fread(pfVar27,4,1,__stream);
            fread(&local_e44,4,1,__stream);
            fread(&local_e48,4,1,__stream);
            lVar11 = 3;
            do {
              uVar1 = *(undefined1 *)pfVar27;
              *(undefined1 *)pfVar27 = *(undefined1 *)((long)&local_e34 + lVar11);
              lVar22 = local_e10;
              lVar23 = local_e18;
              lVar21 = local_e20;
              lVar26 = local_e28;
              lVar13 = local_e30;
              *(undefined1 *)((long)&local_e34 + lVar11) = uVar1;
              lVar11 = lVar11 + -1;
              pfVar27 = (float *)((long)pfVar27 + 1);
            } while (lVar11 != 1);
            lVar11 = 3;
            pfVar27 = &local_e44;
            do {
              uVar1 = *(undefined1 *)pfVar27;
              *(undefined1 *)pfVar27 = *(undefined1 *)((long)&local_e44 + lVar11);
              *(undefined1 *)((long)&local_e44 + lVar11) = uVar1;
              lVar11 = lVar11 + -1;
              pfVar27 = (float *)((long)pfVar27 + 1);
            } while (lVar11 != 1);
            lVar11 = 3;
            pfVar27 = &local_e48;
            do {
              uVar1 = *(undefined1 *)pfVar27;
              *(undefined1 *)pfVar27 = *(undefined1 *)((long)&local_e48 + lVar11);
              *(undefined1 *)((long)&local_e48 + lVar11) = uVar1;
              lVar11 = lVar11 + -1;
              pfVar27 = (float *)((long)pfVar27 + 1);
            } while (lVar11 != 1);
            auVar2._8_4_ = SUB84((double)local_e44,0);
            auVar2._0_8_ = (double)local_e34;
            auVar2._12_4_ = (int)((ulong)(double)local_e44 >> 0x20);
            *__ptr = auVar2;
            *(double *)__ptr[1] = (double)local_e48;
          }
          lVar11 = local_e08 + 1;
          lVar23 = lVar23 + 0x18;
          lVar13 = lVar13 + 0x18;
          lVar21 = lVar21 + 0x18;
          lVar26 = lVar26 + 0x18;
          lVar22 = lVar22 + 0x18;
        } while (lVar11 < (int)local_e4c);
      }
      else if ((local_df4 == 0x49 && local_df8 == 0x49435341) && 0 < (int)uVar5) {
        lVar13 = 0;
LAB_00112c5e:
        do {
          pbVar8 = (byte *)fgets((char *)local_838,0x7ff,__stream);
          uVar24 = uVar24 + 1;
          if (pbVar8 == (byte *)0x0) {
            pcVar20 = "Unexpected end of file on line %d in file %s\n";
LAB_00113584:
            printf(pcVar20,(ulong)uVar24,local_c38);
            fclose(__stream);
            return false;
          }
          for (; uVar10 = (ulong)*pbVar8, uVar10 < 0x21; pbVar8 = pbVar8 + 1) {
            if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
              if ((0x2401UL >> (uVar10 & 0x3f) & 1) != 0) goto LAB_00112c5e;
              break;
            }
          }
          pdVar9 = local_e40->pointlist;
          lVar26 = 0;
          local_e30 = lVar13;
          do {
            local_e68 = pbVar8;
            if ((char)uVar10 == '\0') {
              printf("Syntax error reading vertex coords on line");
              pcVar20 = " %d in file %s\n";
              goto LAB_00113584;
            }
            dVar3 = strtod((char *)pbVar8,(char **)&local_e68);
            pdVar9[lVar13 * 3 + lVar26] = dVar3;
            pbVar8 = local_e68;
            while ((uVar10 = (ulong)*pbVar8, 0x2c < uVar10 ||
                   ((0x100900000201U >> (uVar10 & 0x3f) & 1) == 0))) {
              pbVar8 = pbVar8 + 1;
            }
LAB_00112d05:
            if (0x2e < (byte)uVar10) {
LAB_00112d22:
              if (0xf5 < (byte)((byte)uVar10 - 0x3a)) goto LAB_00112d31;
              uVar10 = (ulong)pbVar8[1];
              pbVar8 = pbVar8 + 1;
              goto LAB_00112d05;
            }
            if ((0x680000000001U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_00112d31;
            if (uVar10 != 0x23) goto LAB_00112d22;
            *pbVar8 = 0;
            uVar10 = 0;
LAB_00112d31:
            lVar26 = lVar26 + 1;
          } while (lVar26 != 3);
          lVar13 = local_e30 + 1;
          local_e68 = pbVar8;
        } while (lVar13 < (int)local_e4c);
      }
    }
    pbVar8 = (byte *)fgets((char *)local_838,0x7ff,__stream);
    uVar24 = uVar24 + 1;
  } while (pbVar8 != (byte *)0x0);
  goto LAB_00113338;
  while( true ) {
    piVar15 = &local_e50;
    fread(piVar15,4,1,__stream);
    fread(__ptr_00,4,1,__stream);
    fread(&local_e58,4,1,__stream);
    lVar13 = 3;
    do {
      iVar6 = *piVar15;
      *(undefined1 *)piVar15 = *(undefined1 *)((long)&local_e50 + lVar13);
      *(char *)((long)&local_e50 + lVar13) = (char)iVar6;
      lVar13 = lVar13 + -1;
      piVar15 = (int *)((long)piVar15 + 1);
    } while (lVar13 != 1);
    lVar13 = 3;
    do {
      iVar6 = *__ptr_00;
      *(undefined1 *)__ptr_00 = *(undefined1 *)((long)&local_e54 + lVar13);
      *(char *)((long)&local_e54 + lVar13) = (char)iVar6;
      lVar13 = lVar13 + -1;
      __ptr_00 = (int *)((long)__ptr_00 + 1);
    } while (lVar13 != 1);
    lVar13 = 3;
    piVar15 = &local_e58;
    do {
      iVar6 = *piVar15;
      *(undefined1 *)piVar15 = *(undefined1 *)((long)&local_e58 + lVar13);
      *(char *)((long)&local_e58 + lVar13) = (char)iVar6;
      lVar13 = lVar13 + -1;
      piVar15 = (int *)((long)piVar15 + 1);
    } while (lVar13 != 1);
    pfVar12 = ptVar25->facetlist;
    pfVar12[local_e70].polygonlist = (polygon *)0x0;
    pfVar12[local_e70].holelist = (double *)0x0;
    pfVar12[local_e70].numberofholes = 0;
    pfVar12[local_e70].numberofpolygons = 1;
    ppVar14 = (polygon *)operator_new__(0x10);
    pfVar12[local_e70].polygonlist = ppVar14;
    ppVar14->vertexlist = (int *)0x0;
    ppVar14->numberofvertices = 3;
    piVar15 = (int *)operator_new__(0xc);
    ppVar14->vertexlist = piVar15;
    *piVar15 = local_e50;
    piVar15[1] = local_e54;
    piVar15[2] = local_e58;
    lVar13 = 0;
    do {
      if (piVar15[lVar13] < (int)uVar19) {
        uVar19 = piVar15[lVar13];
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    local_e70 = local_e70 + 1;
    iVar6 = 3;
    ptVar25 = local_e40;
    if ((int)local_e38 <= local_e70) break;
LAB_0011337e:
    __ptr_00 = &local_e54;
    piVar15 = &local_e5c;
    fread(piVar15,4,1,__stream);
    lVar13 = 3;
    do {
      iVar4 = *piVar15;
      *(undefined1 *)piVar15 = *(undefined1 *)((long)&local_e5c + lVar13);
      *(char *)((long)&local_e5c + lVar13) = (char)iVar4;
      lVar13 = lVar13 + -1;
      piVar15 = (int *)((long)piVar15 + 1);
    } while (lVar13 != 1);
    if (iVar6 != local_e5c && local_e70 != 0) goto LAB_0011354b;
    if (local_e5c != 3) {
      pcVar20 = "Error: Only triangles are supported";
      goto LAB_0011300c;
    }
  }
  goto LAB_00113327;
LAB_0011354b:
  pcVar20 = "Error:  No mixed cells are allowed.";
LAB_0011300c:
  puts(pcVar20);
  return false;
LAB_001130ec:
  do {
    pbVar8 = (byte *)fgets((char *)local_838,0x7ff,__stream);
    if (pbVar8 == (byte *)0x0) {
      pbVar8 = (byte *)0x0;
    }
    else {
      for (; uVar10 = (ulong)*pbVar8, uVar10 < 0x21; pbVar8 = pbVar8 + 1) {
        if ((0x2401UL >> (uVar10 & 0x3f) & 1) != 0) goto LAB_001130ec;
        if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) break;
      }
    }
    local_e68 = pbVar8;
    lVar13 = strtol((char *)pbVar8,(char **)&local_e68,0);
    local_e5c = (int)lVar13;
    if ((local_e70 != 0) && (iVar6 != local_e5c)) goto LAB_0011354b;
    if (local_e5c != 3) {
      pcVar20 = "Error:  Only triangles are supported.";
      goto LAB_0011300c;
    }
    while ((uVar10 = (ulong)*local_e68, 0x2c < uVar10 ||
           ((0x100900000201U >> (uVar10 & 0x3f) & 1) == 0))) {
      local_e68 = local_e68 + 1;
    }
LAB_00113187:
    if (0x2e < (byte)uVar10) {
LAB_0011319a:
      if (0xf5 < (byte)((byte)uVar10 - 0x3a)) goto LAB_001131a5;
      uVar10 = (ulong)local_e68[1];
      local_e68 = local_e68 + 1;
      goto LAB_00113187;
    }
    if ((0x680000000001U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_001131a5;
    if (uVar10 != 0x23) goto LAB_0011319a;
    *local_e68 = 0;
LAB_001131a5:
    local_e30 = strtol((char *)local_e68,(char **)&local_e68,0);
    local_e50 = (int)local_e30;
    while ((uVar10 = (ulong)*local_e68, 0x2c < uVar10 ||
           ((0x100900000201U >> (uVar10 & 0x3f) & 1) == 0))) {
      local_e68 = local_e68 + 1;
    }
LAB_001131de:
    if (0x2e < (byte)uVar10) {
LAB_001131f1:
      if (0xf5 < (byte)((byte)uVar10 - 0x3a)) goto LAB_001131fc;
      uVar10 = (ulong)local_e68[1];
      local_e68 = local_e68 + 1;
      goto LAB_001131de;
    }
    if ((0x680000000001U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_001131fc;
    if (uVar10 != 0x23) goto LAB_001131f1;
    *local_e68 = 0;
LAB_001131fc:
    local_e20 = strtol((char *)local_e68,(char **)&local_e68,0);
    local_e54 = (int)local_e20;
    while ((uVar10 = (ulong)*local_e68, 0x2c < uVar10 ||
           ((0x100900000201U >> (uVar10 & 0x3f) & 1) == 0))) {
      local_e68 = local_e68 + 1;
    }
LAB_00113235:
    if (0x2e < (byte)uVar10) {
LAB_00113248:
      if (0xf5 < (byte)((byte)uVar10 - 0x3a)) goto LAB_00113253;
      uVar10 = (ulong)local_e68[1];
      local_e68 = local_e68 + 1;
      goto LAB_00113235;
    }
    if ((0x680000000001U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_00113253;
    if (uVar10 != 0x23) goto LAB_00113248;
    *local_e68 = 0;
LAB_00113253:
    local_e28 = strtol((char *)local_e68,(char **)&local_e68,0);
    local_e58 = (int)local_e28;
    pfVar12 = ptVar25->facetlist;
    pfVar12[local_e70].polygonlist = (polygon *)0x0;
    pfVar12[local_e70].holelist = (double *)0x0;
    pfVar12[local_e70].numberofholes = 0;
    pfVar12[local_e70].numberofpolygons = 1;
    ppVar14 = (polygon *)operator_new__(0x10);
    pfVar12[local_e70].polygonlist = ppVar14;
    ppVar14->vertexlist = (int *)0x0;
    ppVar14->numberofvertices = 3;
    piVar15 = (int *)operator_new__(0xc);
    ppVar14->vertexlist = piVar15;
    *piVar15 = (int)local_e30;
    piVar15[1] = (int)local_e20;
    piVar15[2] = (int)local_e28;
    lVar13 = 0;
    do {
      if (piVar15[lVar13] < (int)uVar19) {
        uVar19 = piVar15[lVar13];
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    local_e70 = local_e70 + 1;
    iVar6 = 3;
    ptVar25 = local_e40;
  } while (local_e70 < (int)local_e38);
LAB_00113327:
  fclose(__stream);
  if (uVar19 < 2) {
    ptVar25->firstnumber = uVar19;
LAB_00113338:
    bVar18 = true;
  }
  else {
    bVar18 = false;
    printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)uVar19,local_c38);
  }
  return bVar18;
}

Assistant:

bool tetgenio::load_vtk(char* filebasename)
{
  FILE *fp;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char line[INPUTLINESIZE];
  char mode[128], id[256], fmt[64];
  char *bufferp;
  double *coord;
  float _x, _y, _z;
  int nverts = 0;
  int nfaces = 0;
  int line_count = 0;
  int dummy;
  int id1, id2, id3;
  int nn = -1;
  int nn_old = -1;
  int i, j;
  bool ImALittleEndian = !testIsBigEndian();

  int smallestidx = 0;

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 4], ".vtk") != 0) {
    strcat(infilename, ".vtk");
  }
  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  // Default uses the index starts from '0'.
  firstnumber = 0;
  strcpy(mode, "BINARY");

  while((bufferp = readline(line, fp, &line_count)) != NULL) {
    if(strlen(line) == 0) continue;
    //swallow lines beginning with a comment sign or white space
    if(line[0] == '#' || line[0]=='\n' || line[0] == 10 || line[0] == 13 || 
       line[0] == 32) continue;

    sscanf(line, "%s", id);
    if(!strcmp(id, "ASCII")) {
      strcpy(mode, "ASCII");
    }

    if(!strcmp(id, "POINTS")) {
      sscanf(line, "%s %d %s", id, &nverts, fmt);
      if (nverts > 0) {
        numberofpoints = nverts;
        pointlist = new REAL[nverts * 3];
        smallestidx = nverts + 1;
      }

      if(!strcmp(mode, "BINARY")) {
        for(i = 0; i < nverts; i++) {
          coord = &pointlist[i * 3];
          if(!strcmp(fmt, "double")) {
            fread((char*)(&(coord[0])), sizeof(double), 1, fp);
            fread((char*)(&(coord[1])), sizeof(double), 1, fp);
            fread((char*)(&(coord[2])), sizeof(double), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &(coord[0]), sizeof(coord[0]));
              swapBytes((unsigned char *) &(coord[1]), sizeof(coord[1]));
              swapBytes((unsigned char *) &(coord[2]), sizeof(coord[2]));
            }
          } else if(!strcmp(fmt, "float")) {
            fread((char*)(&_x), sizeof(float), 1, fp);
            fread((char*)(&_y), sizeof(float), 1, fp);
            fread((char*)(&_z), sizeof(float), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &_x, sizeof(_x));
              swapBytes((unsigned char *) &_y, sizeof(_y));
              swapBytes((unsigned char *) &_z, sizeof(_z));
            }
            coord[0] = double(_x);
            coord[1] = double(_y);
            coord[2] = double(_z);
          } else {
            printf("Error: Only float or double formats are supported!\n");
            return false;
          }
        }
      } else if(!strcmp(mode, "ASCII")) {
        for(i = 0; i < nverts; i++){
          bufferp = readline(line, fp, &line_count);
          if (bufferp == NULL) {
            printf("Unexpected end of file on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          // Read vertex coordinates
          coord = &pointlist[i * 3];
          for (j = 0; j < 3; j++) {
            if (*bufferp == '\0') {
              printf("Syntax error reading vertex coords on line");
              printf(" %d in file %s\n", line_count, infilename);
              fclose(fp);
              return false;
            }
            coord[j] = (REAL) strtod(bufferp, &bufferp);
            bufferp = findnextnumber(bufferp);
          }
        }
      }
      continue;
    }

    if(!strcmp(id, "POLYGONS")) {
      sscanf(line, "%s %d  %d", id, &nfaces, &dummy);
      if (nfaces > 0) {
        numberoffacets = nfaces;
        facetlist = new tetgenio::facet[nfaces];
      }

      if(!strcmp(mode, "BINARY")) {
        for(i = 0; i < nfaces; i++){
          fread((char*)(&nn), sizeof(int), 1, fp);
          if(ImALittleEndian){
            swapBytes((unsigned char *) &nn, sizeof(nn));
          }
          if (i == 0)
            nn_old = nn;
          if (nn != nn_old) {
            printf("Error:  No mixed cells are allowed.\n");
            return false;
          }

          if(nn == 3){
            fread((char*)(&id1), sizeof(int), 1, fp);
            fread((char*)(&id2), sizeof(int), 1, fp);
            fread((char*)(&id3), sizeof(int), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &id1, sizeof(id1));
              swapBytes((unsigned char *) &id2, sizeof(id2));
              swapBytes((unsigned char *) &id3, sizeof(id3));
            }
            f = &facetlist[i];
            init(f);
            // In .off format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            init(p);
            // Set number of vertices
            p->numberofvertices = 3;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            p->vertexlist[0] = id1;
            p->vertexlist[1] = id2;
            p->vertexlist[2] = id3;
            // Detect the smallest index.
            for (j = 0; j < 3; j++) {
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
            }
          } else {
            printf("Error: Only triangles are supported\n");
            return false;
          }
        }
      } else if(!strcmp(mode, "ASCII")) {
        for(i = 0; i < nfaces; i++) {
          bufferp = readline(line, fp, &line_count);
          nn = (int) strtol(bufferp, &bufferp, 0);
          if (i == 0)
            nn_old = nn;
          if (nn != nn_old) {
            printf("Error:  No mixed cells are allowed.\n");
            return false;
          }

          if (nn == 3) {
            bufferp = findnextnumber(bufferp); // Skip the first field.
            id1 = (int) strtol(bufferp, &bufferp, 0);
            bufferp = findnextnumber(bufferp);
            id2 = (int) strtol(bufferp, &bufferp, 0);
            bufferp = findnextnumber(bufferp);
            id3 = (int) strtol(bufferp, &bufferp, 0);
            f = &facetlist[i];
            init(f);
            // In .off format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            init(p);
            // Set number of vertices
            p->numberofvertices = 3;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            p->vertexlist[0] = id1;
            p->vertexlist[1] = id2;
            p->vertexlist[2] = id3;
            // Detect the smallest index.
            for (j = 0; j < 3; j++) {
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
            }
          } else {
            printf("Error:  Only triangles are supported.\n");
            return false;
          }
        }
      }

      fclose(fp);

      // Decide the firstnumber of the index.
      if (smallestidx == 0) {
        firstnumber = 0;  
      } else if (smallestidx == 1) {
        firstnumber = 1;
      } else {
        printf("A wrong smallest index (%d) was detected in file %s\n",
               smallestidx, infilename);
        return false;
      }

      return true;
    }

    if(!strcmp(id,"LINES") || !strcmp(id,"CELLS")){
      printf("Warning:  load_vtk(): cannot read formats LINES, CELLS.\n");
    }
  } // while ()

  return true;
}